

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
helper::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,helper *this,string *s,string *delim)

{
  value_type local_a0 [48];
  value_type local_70 [32];
  int local_50;
  int find_pos;
  size_t delim_len;
  size_t len;
  size_t pos;
  string *local_28;
  string *delim_local;
  string *s_local;
  helper *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  
  pos._7_1_ = 0;
  local_28 = delim;
  delim_local = s;
  s_local = (string *)this;
  this_local = (helper *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  len = 0;
  delim_len = std::__cxx11::string::length();
  _find_pos = std::__cxx11::string::length();
  if (_find_pos != 0) {
    while (len < delim_len) {
      local_50 = std::__cxx11::string::find((string *)delim_local,(ulong)local_28);
      if (local_50 < 0) {
        std::__cxx11::string::substr((ulong)local_70,(ulong)delim_local);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,local_70);
        std::__cxx11::string::~string((string *)local_70);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)local_a0,(ulong)delim_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      len = local_50 + _find_pos;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> helper::split(const  std::string& s, const std::string& delim)
{
    std::vector<std::string> elems;
    size_t pos = 0;
    size_t len = s.length();
    size_t delim_len = delim.length();
    if (delim_len == 0) return elems;
    while (pos < len)
    {
        int find_pos = s.find(delim, pos);
        if (find_pos < 0)
        {
            elems.push_back(s.substr(pos, len - pos));
            break;
        }
        elems.push_back(s.substr(pos, find_pos - pos));
        pos = find_pos + delim_len;
    }
    return elems;
}